

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

int __thiscall draco::RAnsDecoder<13>::read_init(RAnsDecoder<13> *this,uint8_t *buf,int offset)

{
  int iVar1;
  uint32_t uVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint x;
  uint local_4;
  
  if (in_EDX < 1) {
    return 1;
  }
  *(long *)(in_RDI + 0x30) = in_RSI;
  iVar1 = (int)(uint)*(byte *)(in_RSI + (in_EDX + -1)) >> 6;
  if (iVar1 == 0) {
    *(int *)(in_RDI + 0x38) = in_EDX + -1;
    *(uint *)(in_RDI + 0x3c) = *(byte *)(in_RSI + (in_EDX + -1)) & 0x3f;
  }
  else if (iVar1 == 1) {
    if (in_EDX < 2) {
      return 1;
    }
    *(int *)(in_RDI + 0x38) = in_EDX + -2;
    uVar2 = mem_get_le16((void *)(in_RSI + in_EDX + -2));
    *(uint32_t *)(in_RDI + 0x3c) = uVar2 & 0x3fff;
  }
  else if (iVar1 == 2) {
    if (in_EDX < 3) {
      return 1;
    }
    *(int *)(in_RDI + 0x38) = in_EDX + -3;
    uVar2 = mem_get_le24((void *)(in_RSI + in_EDX + -3));
    *(uint32_t *)(in_RDI + 0x3c) = uVar2 & 0x3fffff;
  }
  else {
    if (iVar1 != 3) {
      return 1;
    }
    *(int *)(in_RDI + 0x38) = in_EDX + -4;
    uVar2 = mem_get_le32((void *)(in_RSI + in_EDX + -4));
    *(uint32_t *)(in_RDI + 0x3c) = uVar2 & 0x3fffffff;
  }
  *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + 0x8000;
  local_4 = (uint)(0x7fffff < *(uint *)(in_RDI + 0x3c));
  return local_4;
}

Assistant:

inline int read_init(const uint8_t *const buf, int offset) {
    unsigned x;
    if (offset < 1) {
      return 1;
    }
    ans_.buf = buf;
    x = buf[offset - 1] >> 6;
    if (x == 0) {
      ans_.buf_offset = offset - 1;
      ans_.state = buf[offset - 1] & 0x3F;
    } else if (x == 1) {
      if (offset < 2) {
        return 1;
      }
      ans_.buf_offset = offset - 2;
      ans_.state = mem_get_le16(buf + offset - 2) & 0x3FFF;
    } else if (x == 2) {
      if (offset < 3) {
        return 1;
      }
      ans_.buf_offset = offset - 3;
      ans_.state = mem_get_le24(buf + offset - 3) & 0x3FFFFF;
    } else if (x == 3) {
      ans_.buf_offset = offset - 4;
      ans_.state = mem_get_le32(buf + offset - 4) & 0x3FFFFFFF;
    } else {
      return 1;
    }
    ans_.state += l_rans_base;
    if (ans_.state >= l_rans_base * DRACO_ANS_IO_BASE) {
      return 1;
    }
    return 0;
  }